

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_dratio_dnode0
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  REF_DBL *pRVar1;
  undefined1 auVar2 [16];
  double dVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_DBL *pRVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  REF_DBL RVar19;
  REF_DBL ratio0;
  REF_DBL direction_1 [3];
  undefined8 local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  double local_198;
  double local_190;
  double local_188;
  REF_DBL ratio1;
  REF_DBL direction [3];
  REF_DBL d_ratio1 [3];
  REF_DBL d_ratio0 [3];
  REF_DBL d_r [3];
  REF_DBL m [6];
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar9 = "node invalid";
    uVar5 = 3;
    uVar8 = 0x5f0;
    goto LAB_00140be7;
  }
  pRVar1 = ref_node->real;
  uVar5 = (ulong)(uint)(node1 * 0xf);
  uVar7 = (ulong)(uint)(node0 * 0xf);
  direction[0] = pRVar1[uVar5] - pRVar1[uVar7];
  direction[1] = pRVar1[uVar5 + 1] - pRVar1[uVar7 + 1];
  direction[2] = pRVar1[uVar5 + 2] - pRVar1[uVar7 + 2];
  auVar14._0_8_ =
       SQRT(direction[2] * direction[2] + direction[0] * direction[0] + direction[1] * direction[1])
       * 1e+20;
  auVar14._8_8_ = direction[0];
  auVar15._8_4_ = SUB84(direction[0],0);
  auVar15._0_8_ = -auVar14._0_8_;
  auVar15._12_4_ = (uint)((ulong)direction[0] >> 0x20) ^ 0x80000000;
  auVar15 = maxpd(auVar14,auVar15);
  dVar13 = auVar15._0_8_;
  if (auVar15._8_8_ < dVar13) {
    dVar11 = direction[1];
    if (direction[1] <= -direction[1]) {
      dVar11 = -direction[1];
    }
    if (dVar11 < dVar13) {
      dVar11 = direction[2];
      if (direction[2] <= -direction[2]) {
        dVar11 = -direction[2];
      }
      if (dVar11 < dVar13) {
        if (ref_node->ratio_method == 2) {
          *ratio = 0.0;
          *d_ratio = 0.0;
          d_ratio[1] = 0.0;
          d_ratio[2] = 0.0;
          pRVar1 = ref_node->real;
          direction_1[0] = pRVar1[uVar5] - pRVar1[uVar7];
          direction_1[1] = pRVar1[uVar5 + 1] - pRVar1[uVar7 + 1];
          direction_1[2] = pRVar1[uVar5 + 2] - pRVar1[uVar7 + 2];
          ref_node_metric_get_log(ref_node,node0,m);
          ref_node_metric_get_log(ref_node,node1,d_ratio0);
          for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
            d_ratio1[lVar6] = m[lVar6] * 0.5 + d_ratio0[lVar6] * 0.5;
          }
          uVar4 = ref_matrix_exp_m(d_ratio1,d_r);
          if (uVar4 == 0) {
            uVar4 = ref_matrix_sqrt_vt_m_v_deriv(d_r,direction_1,&ratio0,(REF_DBL *)&local_1a8);
            if (uVar4 == 0) {
              *ratio = ratio0 + *ratio;
              dVar13 = d_ratio[1] - (double)CONCAT44(uStack_19c,uStack_1a0);
              auVar2._8_4_ = SUB84(dVar13,0);
              auVar2._0_8_ = *d_ratio - (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8);
              auVar2._12_4_ = (int)((ulong)dVar13 >> 0x20);
              *(undefined1 (*) [16])d_ratio = auVar2;
              d_ratio0[2] = d_ratio[2] - local_198;
              goto LAB_00140de3;
            }
            pcVar9 = "vt m v0";
            uVar8 = 0x5db;
          }
          else {
            pcVar9 = "exp";
            uVar8 = 0x5d9;
          }
          uVar5 = (ulong)uVar4;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 uVar8,"ref_node_dratio_dnode0_quadrature",uVar5,pcVar9);
          pcVar9 = "dratio quad";
          uVar8 = 0x609;
        }
        else {
          ref_node_metric_get(ref_node,node0,m);
          uVar4 = ref_matrix_sqrt_vt_m_v_deriv(m,direction,&ratio0,d_ratio0);
          if (uVar4 == 0) {
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              d_ratio0[lVar6] = -d_ratio0[lVar6];
            }
            ref_node_metric_get(ref_node,node1,m);
            uVar4 = ref_matrix_sqrt_vt_m_v_deriv(m,direction,&ratio1,d_ratio1);
            if (uVar4 == 0) {
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                d_ratio1[lVar6] = -d_ratio1[lVar6];
              }
              if ((1e-12 <= ratio0) && (1e-12 <= ratio1)) {
                pRVar10 = d_ratio0;
                pRVar1 = d_ratio1;
                if (ratio0 < ratio1) {
                  pRVar10 = d_ratio1;
                  pRVar1 = d_ratio0;
                }
                RVar19 = ratio0;
                if (ratio1 <= ratio0) {
                  RVar19 = ratio1;
                }
                direction_1[2] = pRVar1[2];
                if (ratio1 <= ratio0) {
                  d_ratio1[0]._0_4_ = d_ratio0[0]._0_4_;
                  d_ratio1[0]._4_4_ = d_ratio0[0]._4_4_;
                  d_ratio1[1]._0_4_ = d_ratio0[1]._0_4_;
                  d_ratio1[1]._4_4_ = d_ratio0[1]._4_4_;
                }
                uVar16 = SUB84(ratio1,0);
                uVar17 = (undefined4)((ulong)ratio1 >> 0x20);
                if (ratio1 <= ratio0) {
                  uVar16 = SUB84(ratio0,0);
                  uVar17 = (undefined4)((ulong)ratio0 >> 0x20);
                }
                local_1a8._0_4_ = d_ratio1[0]._0_4_;
                local_1a8._4_4_ = d_ratio1[0]._4_4_;
                uStack_1a0 = d_ratio1[1]._0_4_;
                uStack_19c = d_ratio1[1]._4_4_;
                local_198 = pRVar10[2];
                for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                  d_r[lVar6] = ((direction_1[lVar6] * (double)CONCAT44(uVar17,uVar16) +
                                (double)(&local_1a8)[lVar6] * -RVar19) /
                               (double)CONCAT44(uVar17,uVar16)) / (double)CONCAT44(uVar17,uVar16);
                }
                dVar13 = RVar19 / (double)CONCAT44(uVar17,uVar16);
                dVar18 = dVar13 + -1.0;
                dVar11 = dVar18;
                if (dVar18 <= -dVar18) {
                  dVar11 = -dVar18;
                }
                if (1e-12 <= dVar11) {
                  local_190 = log(dVar13);
                  local_190 = local_190 * dVar13;
                  *ratio = (RVar19 * dVar18) / local_190;
                  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                    local_188 = d_r[lVar6];
                    dVar11 = direction_1[lVar6];
                    dVar12 = RVar19 * local_188;
                    dVar3 = log(dVar13);
                    d_ratio[lVar6] =
                         (((dVar12 + dVar11 * dVar18) * local_190 +
                          (local_188 * (dVar13 / dVar13) + dVar3 * local_188) * -(RVar19 * dVar18))
                         / local_190) / local_190;
                  }
                  return 0;
                }
                *ratio = (ratio0 + ratio1) * 0.5;
                for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                  d_ratio[lVar6] = (direction_1[lVar6] + (double)(&local_1a8)[lVar6]) * 0.5;
                }
                return 0;
              }
              if (ratio1 <= ratio0) {
                *ratio = ratio1;
                *d_ratio = (REF_DBL)CONCAT44(d_ratio1[0]._4_4_,d_ratio1[0]._0_4_);
                d_ratio[1] = (REF_DBL)CONCAT44(d_ratio1[1]._4_4_,d_ratio1[1]._0_4_);
                d_ratio0[2] = d_ratio1[2];
              }
              else {
                *ratio = ratio0;
                *d_ratio = (REF_DBL)CONCAT44(d_ratio0[0]._4_4_,d_ratio0[0]._0_4_);
                d_ratio[1] = (REF_DBL)CONCAT44(d_ratio0[1]._4_4_,d_ratio0[1]._0_4_);
              }
LAB_00140de3:
              d_ratio[2] = d_ratio0[2];
              return 0;
            }
            uVar5 = (ulong)uVar4;
            pcVar9 = "vt m v0";
            uVar8 = 0x611;
          }
          else {
            uVar5 = (ulong)uVar4;
            pcVar9 = "vt m v0";
            uVar8 = 0x60e;
          }
        }
LAB_00140be7:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar8,"ref_node_dratio_dnode0",uVar5,pcVar9);
        return (REF_STATUS)uVar5;
      }
    }
  }
  *ratio = 0.0;
  *d_ratio = 0.0;
  d_ratio[1] = 0.0;
  d_ratio[2] = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_dratio_dnode0(REF_NODE ref_node, REF_INT node0,
                                          REF_INT node1, REF_DBL *ratio,
                                          REF_DBL *d_ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, d_ratio0[3], ratio1, d_ratio1[3];
  REF_DBL r, d_r[3], r_min, d_r_min[3], r_max, d_r_max[3];
  REF_INT i;
  REF_DBL r_log_r;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    d_ratio[0] = 0.0;
    d_ratio[1] = 0.0;
    d_ratio[2] = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_dratio_dnode0_quadrature(ref_node, node0, node1, ratio,
                                          d_ratio),
        "dratio quad");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio0, d_ratio0), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio0[i] = -d_ratio0[i]; /* node 0 is neg */
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio1, d_ratio1), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio1[i] = -d_ratio1[i]; /* node 0 is neg */

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    if (ratio0 < ratio1) {
      *ratio = ratio0;
      d_ratio[0] = d_ratio0[0];
      d_ratio[1] = d_ratio0[1];
      d_ratio[2] = d_ratio0[2];
    } else {
      *ratio = ratio1;
      d_ratio[0] = d_ratio1[0];
      d_ratio[1] = d_ratio1[1];
      d_ratio[2] = d_ratio1[2];
    }
    return REF_SUCCESS;
  }

  if (ratio0 < ratio1) {
    r_min = ratio0;
    d_r_min[0] = d_ratio0[0];
    d_r_min[1] = d_ratio0[1];
    d_r_min[2] = d_ratio0[2];
    r_max = ratio1;
    d_r_max[0] = d_ratio1[0];
    d_r_max[1] = d_ratio1[1];
    d_r_max[2] = d_ratio1[2];
  } else {
    r_min = ratio1;
    d_r_min[0] = d_ratio1[0];
    d_r_min[1] = d_ratio1[1];
    d_r_min[2] = d_ratio1[2];
    r_max = ratio0;
    d_r_max[0] = d_ratio0[0];
    d_r_max[1] = d_ratio0[1];
    d_r_max[2] = d_ratio0[2];
  }

  r = r_min / r_max;
  for (i = 0; i < 3; i++)
    d_r[i] = (d_r_min[i] * r_max - r_min * d_r_max[i]) / r_max / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (r_min + r_max);
    for (i = 0; i < 3; i++) d_ratio[i] = 0.5 * (d_r_min[i] + d_r_max[i]);
    return REF_SUCCESS;
  }

  r_log_r = r * log(r);
  *ratio = r_min * (r - 1.0) / r_log_r;

  for (i = 0; i < 3; i++)
    d_ratio[i] = ((r_min * d_r[i] + d_r_min[i] * (r - 1.0)) * r_log_r -
                  r_min * (r - 1.0) * (r * 1 / r * d_r[i] + d_r[i] * log(r))) /
                 r_log_r / r_log_r;

  return REF_SUCCESS;
}